

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryIndexedTree.hpp
# Opt level: O1

void __thiscall
primesum::BinaryIndexedTree::init<std::vector<char,std::allocator<char>>>
          (BinaryIndexedTree *this,vector<char,_std::allocator<char>_> *sieve,int64_t low)

{
  ulong uVar1;
  ulong uVar2;
  pointer pcVar3;
  pointer p_Var4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar5 = (ulong)((long)(sieve->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(sieve->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 1;
  this->size_ = uVar5;
  std::vector<__int128,_std::allocator<__int128>_>::resize(&this->tree_,uVar5);
  uVar5 = this->size_;
  if (0 < (long)uVar5) {
    pcVar3 = (sieve->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    p_Var4 = (this->tree_).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      lVar8 = (long)pcVar3[uVar6 * 2] * (low + uVar6 * 2);
      *(long *)(p_Var4 + uVar6) = lVar8;
      *(long *)((long)p_Var4 + uVar6 * 0x10 + 8) = lVar8 >> 0x3f;
      uVar1 = uVar6 + 1;
      if (1 < (~uVar6 & uVar1)) {
        puVar7 = (ulong *)(p_Var4 + uVar6);
        uVar9 = *puVar7;
        uVar10 = puVar7[1];
        uVar11 = ~uVar6 & uVar1;
        do {
          uVar2 = uVar6 - 1;
          bVar12 = CARRY8(uVar9,*(ulong *)(p_Var4 + uVar2));
          uVar9 = uVar9 + *(ulong *)(p_Var4 + uVar2);
          uVar10 = uVar10 + *(long *)((long)p_Var4 + uVar2 * 0x10 + 8) + (ulong)bVar12;
          *puVar7 = uVar9;
          puVar7[1] = uVar10;
          uVar6 = uVar6 & uVar2;
          bVar12 = 3 < uVar11;
          uVar11 = uVar11 >> 1;
        } while (bVar12);
      }
      uVar6 = uVar1;
    } while (uVar1 != uVar5);
  }
  return;
}

Assistant:

void init(const T& sieve, int64_t low)
  {
    size_ = sieve.size() / 2;
    tree_.resize(size_);

    for (int64_t i = 0; i < size_; i++)
    {
      int64_t i2 = i * 2;
      tree_[i] = (low + i2) * sieve[i2];
      int64_t k = (i + 1) & ~i;
      for (int64_t j = i; k >>= 1; j &= j - 1)
        tree_[i] += tree_[j - 1];
    }
  }